

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

bool dirDEFARRAY_parseItems(CStringsList **nextPtr)

{
  bool bVar1;
  int iVar2;
  CStringsList *this;
  char **local_828;
  char *n;
  char *itemLp;
  char ml [2048];
  CStringsList **nextPtr_local;
  
  ml._2040_8_ = nextPtr;
  do {
    n = lp;
    local_828 = &itemLp;
    iVar2 = GetMacroArgumentValue(&lp,(char **)&local_828);
    if (iVar2 == 0) {
      Error("[DEFARRAY] Syntax error",n,SUPPRESS);
      return false;
    }
    this = (CStringsList *)operator_new(0x28);
    CStringsList::CStringsList(this,(char *)&itemLp,(CStringsList *)0x0);
    *(CStringsList **)ml._2040_8_ = this;
    if (**(long **)ml._2040_8_ == 0) {
      ErrorOOM();
    }
    ml._2040_8_ = *(long *)ml._2040_8_ + 8;
    bVar1 = anyComma(&lp);
  } while (bVar1);
  iVar2 = SkipBlanks();
  return iVar2 != 0;
}

Assistant:

static bool dirDEFARRAY_parseItems(CStringsList** nextPtr) {
	char ml[LINEMAX];
	do {
		const char* const itemLp = lp;
		char* n = ml;
		if (!GetMacroArgumentValue(lp, n)) {
			Error("[DEFARRAY] Syntax error", itemLp, SUPPRESS);
			return false;
		}
		*nextPtr = new CStringsList(ml);
		if ((*nextPtr)->string == NULL) ErrorOOM();
		nextPtr = &((*nextPtr)->next);
	} while (anyComma(lp));
	return SkipBlanks();
}